

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O3

bool Js::EquivalentTypeSet::AreIdentical(EquivalentTypeSet *left,EquivalentTypeSet *right)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  long lVar5;
  
  if (left->sortedAndDuplicatesRemoved == false) {
    SortAndRemoveDuplicates(left);
  }
  if (right->sortedAndDuplicatesRemoved == false) {
    SortAndRemoveDuplicates(right);
  }
  if ((left->sortedAndDuplicatesRemoved != true) || (right->sortedAndDuplicatesRemoved == false)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EquivalentTypeSet.cpp"
                                ,0x41,
                                "(left->GetSortedAndDuplicatesRemoved() && right->GetSortedAndDuplicatesRemoved())"
                                ,
                                "left->GetSortedAndDuplicatesRemoved() && right->GetSortedAndDuplicatesRemoved()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (left->count == right->count) {
    if (left->count == 0) {
      bVar2 = true;
    }
    else {
      lVar5 = 0;
      uVar4 = 0;
      do {
        bVar2 = JITTypeHolderBase<Memory::Recycler>::operator!=
                          ((JITTypeHolderBase<Memory::Recycler> *)
                           ((long)&(((left->types).ptr)->t).ptr + lVar5),
                           (JITTypeHolderBase<Memory::Recycler> *)
                           ((long)&(((right->types).ptr)->t).ptr + lVar5));
        if (bVar2) break;
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 8;
      } while (uVar4 < left->count);
      bVar2 = !bVar2;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool EquivalentTypeSet::AreIdentical(EquivalentTypeSet * left, EquivalentTypeSet * right)
{
    if (!left->GetSortedAndDuplicatesRemoved())
    {
        left->SortAndRemoveDuplicates();
    }
    if (!right->GetSortedAndDuplicatesRemoved())
    {
        right->SortAndRemoveDuplicates();
    }

    Assert(left->GetSortedAndDuplicatesRemoved() && right->GetSortedAndDuplicatesRemoved());

    if (left->count != right->count)
    {
        return false;
    }

    // TODO: OOP JIT, optimize this (previously we had memcmp)
    for (uint i = 0; i < left->count; ++i)
    {
        if (left->types[i] != right->types[i])
        {
            return false;
        }
    }
    return true;
}